

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O2

nh_bool option_change_callback(nh_option_desc *option)

{
  char *__s1;
  int iVar1;
  
  __s1 = option->name;
  iVar1 = strcmp(__s1,"classic_status");
  if ((((iVar1 == 0) || (iVar1 = strcmp(__s1,"darkmsg"), iVar1 == 0)) ||
      (iVar1 = strcmp(__s1,"frame"), iVar1 == 0)) ||
     (((iVar1 = strcmp(__s1,"frame_hp_color"), iVar1 == 0 ||
       (iVar1 = strcmp(__s1,"status3"), iVar1 == 0)) || (iVar1 = strcmp(__s1,"sidebar"), iVar1 == 0)
      ))) {
LAB_0010efd4:
    rebuild_ui();
  }
  else {
    iVar1 = strcmp(__s1,"showexp");
    if (((iVar1 == 0) || (iVar1 = strcmp(__s1,"showscore"), iVar1 == 0)) ||
       (iVar1 = strcmp(__s1,"time"), iVar1 == 0)) {
      curses_update_status((nh_player_info *)0x0);
      return '\x01';
    }
    iVar1 = strcmp(__s1,"darkroom");
    if ((((iVar1 != 0) && (iVar1 = strcmp(__s1,"hilite_peaceful"), iVar1 != 0)) &&
        (iVar1 = strcmp(__s1,"hilite_pet"), iVar1 != 0)) &&
       (iVar1 = strcmp(__s1,"mapcolors"), iVar1 != 0)) {
      iVar1 = strcmp(__s1,"darkgray");
      if (iVar1 != 0) {
        iVar1 = strcmp(__s1,"dungeon_name");
        if (iVar1 == 0) {
          settings.dungeon_name = (option->value).i;
        }
        else {
          iVar1 = strcmp(__s1,"menu_headings");
          if (iVar1 == 0) {
            settings.menu_headings = (option->value).i;
            return '\x01';
          }
          iVar1 = strcmp(__s1,"graphics");
          if (iVar1 == 0) {
            settings.graphics = (option->value).i;
            switch_graphics(settings.graphics);
            if (ui_flags.ingame != '\0') {
              draw_map(player.x,player.y);
              redraw_game_windows();
              return '\x01';
            }
            return '\x01';
          }
          iVar1 = strcmp(__s1,"scores_top");
          if (iVar1 == 0) {
            settings.end_top = (option->value).i;
            return '\x01';
          }
          iVar1 = strcmp(__s1,"scores_around");
          if (iVar1 == 0) {
            settings.end_around = (option->value).i;
            return '\x01';
          }
          iVar1 = strcmp(__s1,"optstyle");
          if (iVar1 == 0) {
            settings.optstyle = (option->value).i;
            return '\x01';
          }
          iVar1 = strcmp(__s1,"msgheight");
          if (iVar1 != 0) {
            iVar1 = strcmp(__s1,"msghistory");
            if (iVar1 == 0) {
              settings.msghistory = (option->value).i;
              alloc_hist_array();
              return '\x01';
            }
            iVar1 = strcmp(__s1,"name");
            if (iVar1 == 0) {
              if ((option->value).s != (char *)0x0) {
                strcpy(settings.plname,(option->value).s);
                return '\x01';
              }
              settings.plname[0] = '\0';
              return '\x01';
            }
            return '\0';
          }
          settings.msgheight = (option->value).i;
        }
        goto LAB_0010efd4;
      }
      set_darkgray();
    }
    draw_map(player.x,player.y);
  }
  return '\x01';
}

Assistant:

static nh_bool option_change_callback(struct nh_option_desc *option)
{
    if (!strcmp(option->name, "classic_status") ||
	!strcmp(option->name, "darkmsg") ||
	!strcmp(option->name, "frame") ||
	!strcmp(option->name, "frame_hp_color") ||
	!strcmp(option->name, "status3") ||
	!strcmp(option->name, "sidebar")) {
	rebuild_ui();
	return TRUE;
    }
    else if (!strcmp(option->name, "showexp") ||
	!strcmp(option->name, "showscore") ||
	!strcmp(option->name, "time")) {
	curses_update_status(NULL);
    }
    else if (!strcmp(option->name, "darkroom") ||
	!strcmp(option->name, "hilite_peaceful") ||
	!strcmp(option->name, "hilite_pet") ||
	!strcmp(option->name, "mapcolors")) {
	draw_map(player.x, player.y);
    }
    else if (!strcmp(option->name, "darkgray")) {
	set_darkgray();
	draw_map(player.x, player.y);
    }
    else if (!strcmp(option->name, "dungeon_name")) {
	settings.dungeon_name = option->value.e;
	rebuild_ui();
    }
    else if (!strcmp(option->name, "menu_headings")) {
	settings.menu_headings = option->value.e;
    }
    else if (!strcmp(option->name, "graphics")) {
	settings.graphics = option->value.e;
	switch_graphics(option->value.e);
	if (ui_flags.ingame) {
	    draw_map(player.x, player.y);
	    redraw_game_windows();
	}
    }
    else if (!strcmp(option->name, "scores_top")) {
	settings.end_top = option->value.i;
    }
    else if (!strcmp(option->name, "scores_around")) {
	settings.end_around = option->value.i;
    }
    else if (!strcmp(option->name, "optstyle")) {
	settings.optstyle = option->value.e;
    }
    else if (!strcmp(option->name, "msgheight")) {
	settings.msgheight = option->value.i;
	rebuild_ui();
    }
    else if (!strcmp(option->name, "msghistory")) {
	settings.msghistory = option->value.i;
	alloc_hist_array();
    }
#if defined(PDCURSES) && defined(WIN32)
    else if (!strcmp(option->name, "win_width")) {
	settings.win_width = option->value.i;
	resize_term(settings.win_height, settings.win_width);
	handle_resize();
    }
    else if (!strcmp(option->name, "win_height")) {
	settings.win_height = option->value.i;
	resize_term(settings.win_height, settings.win_width);
	handle_resize();
    }
#endif
    else if (!strcmp(option->name, "name")) {
	if (option->value.s)
	    strcpy(settings.plname, option->value.s);
	else
	    settings.plname[0] = '\0';
    }
    else
	return FALSE;
    
    return TRUE;
}